

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

CommandSignature __thiscall
anon_unknown.dwarf_199c2b::SymlinkCommand::getSignature(SymlinkCommand *this)

{
  BuildNode *pBVar1;
  pointer ppBVar2;
  hash_code hVar3;
  size_t in_RDX;
  pointer ppBVar4;
  StringRef S;
  StringRef local_c0;
  hash_combine_recursive_helper local_b0;
  
  pBVar1 = *(this->super_Command).outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  S.Length = in_RDX;
  S.Data = (char *)(pBVar1->super_Node).name._M_string_length;
  hVar3 = llvm::hash_value((llvm *)(pBVar1->super_Node).name._M_dataplus._M_p,S);
  llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_b0);
  local_b0.buffer._0_8_ = hVar3;
  hVar3 = llvm::hashing::detail::hash_combine_recursive_helper::combine<std::__cxx11::string>
                    (&local_b0,0,local_b0.buffer + 8,(char *)&local_b0.state,&this->contents);
  ppBVar4 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar2 = (this->super_Command).inputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar4 != ppBVar2) {
    do {
      local_c0.Data = ((*ppBVar4)->super_Node).name._M_dataplus._M_p;
      local_c0.Length = ((*ppBVar4)->super_Node).name._M_string_length;
      llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper(&local_b0)
      ;
      local_b0.buffer._0_8_ = hVar3.value;
      hVar3 = llvm::hashing::detail::hash_combine_recursive_helper::combine<llvm::StringRef>
                        (&local_b0,0,local_b0.buffer + 8,(char *)&local_b0.state,&local_c0);
      ppBVar4 = ppBVar4 + 1;
    } while (ppBVar4 != ppBVar2);
  }
  return (CommandSignature)hVar3.value;
}

Assistant:

virtual CommandSignature getSignature() const override {
    CommandSignature code(outputs[0]->getName());
    code = code.combine(contents);
    for (const auto* input: inputs) {
      code = code.combine(input->getName());
    }
    return code;
  }